

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathDestroyWriter(CP_Services Svcs,DP_WS_Stream WS_Stream_v)

{
  void *in_RSI;
  int i;
  Evpath_WS_Stream WS_Stream;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < *(int *)((long)in_RSI + 0x58); local_1c = local_1c + 1) {
    if (*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) != 0) {
      free((void *)**(undefined8 **)
                     (*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x38));
      free(*(void **)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x38));
      free((void *)**(undefined8 **)
                     (*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x30));
      if (*(long *)(*(long *)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x30)
                   + 8) != 0) {
        CMConnection_dereference
                  (*(undefined8 *)
                    (*(long *)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x30
                              ) + 8));
        *(undefined8 *)
         (*(long *)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x30) + 8) = 0;
      }
      if (*(long *)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x20) != 0) {
        free(*(void **)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x20));
      }
      free(*(void **)(*(long *)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8) + 0x30));
      free(*(void **)(*(long *)((long)in_RSI + 0x60) + (long)local_1c * 8));
    }
  }
  free(*(void **)((long)in_RSI + 0x60));
  free(in_RSI);
  return;
}

Assistant:

static void EvpathDestroyWriter(CP_Services Svcs, DP_WS_Stream WS_Stream_v)
{
    Evpath_WS_Stream WS_Stream = (Evpath_WS_Stream)WS_Stream_v;
    for (int i = 0; i < WS_Stream->ReaderCount; i++)
    {
        if (WS_Stream->Readers[i])
        {
            free(WS_Stream->Readers[i]->WriterContactInfo->ContactString);
            free(WS_Stream->Readers[i]->WriterContactInfo);
            free(WS_Stream->Readers[i]->ReaderContactInfo->ContactString);
            if (WS_Stream->Readers[i]->ReaderContactInfo->Conn)
            {
                CMConnection_dereference(WS_Stream->Readers[i]->ReaderContactInfo->Conn);
                WS_Stream->Readers[i]->ReaderContactInfo->Conn = NULL;
            }
            if (WS_Stream->Readers[i]->ReaderRequestArray)
            {
                free(WS_Stream->Readers[i]->ReaderRequestArray);
            }
            free(WS_Stream->Readers[i]->ReaderContactInfo);
            free(WS_Stream->Readers[i]);
        }
    }
    free(WS_Stream->Readers);
    free(WS_Stream);
}